

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

wchar_t prompt_for_easy_filter(equippable_summary *s,_Bool apply_not)

{
  equippable_expr *peVar1;
  wchar_t *pwVar2;
  equippable_expr *peVar3;
  bool bVar4;
  undefined4 uVar5;
  equippable_selfunc_extra eVar6;
  equippable_summary *peVar7;
  _Bool _Var8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t extraout_EAX;
  undefined7 extraout_var;
  __int32_t **pp_Var11;
  __int32_t *p_Var12;
  size_t sVar13;
  long lVar14;
  equippable_selfunc p_Var15;
  undefined1 *puVar16;
  char cVar17;
  bool bVar18;
  undefined1 *puVar19;
  wchar_t wVar20;
  equippable_summary *peVar21;
  int iVar22;
  int iVar23;
  char c [4];
  wchar_t wc [4];
  wchar_t wce [4];
  char local_90;
  undefined1 local_8f [3];
  char local_8c [4];
  equippable_summary *local_88;
  int local_7c;
  wchar_t local_78;
  wchar_t local_74;
  int local_70;
  wchar_t local_68;
  wchar_t local_64;
  int local_60;
  equippable_selfunc local_50;
  equippable_selfunc local_48;
  equippable_selfunc local_40;
  equippable_selfunc local_38;
  
  local_8c[0] = '\0';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  _Var8 = get_string("Enter 2 or 3 (for stat) character code and return or return to clear ",
                     local_8c,4);
  wVar10 = (wchar_t)CONCAT71(extraout_var,_Var8);
  if (_Var8) {
    if (local_8c[0] == '\0') {
      s->config_filt_is_on = false;
      wVar20 = (s->easy_filt).nv;
      wVar10 = get_expected_easy_filter_count(s->stores);
      if (wVar10 < wVar20) {
        peVar3 = (s->easy_filt).v;
        lVar14 = (long)(s->easy_filt).nv;
        uVar5 = *(undefined4 *)&peVar3[lVar14].field_0x14;
        peVar3[lVar14 + -1].c = peVar3[lVar14].c;
        *(undefined4 *)&peVar3[lVar14 + -1].field_0x14 = uVar5;
        peVar1 = peVar3 + lVar14;
        eVar6 = (peVar1->s).ex;
        uVar5 = *(undefined4 *)&(peVar1->s).field_0xc;
        peVar3 = peVar3 + lVar14 + -1;
        (peVar3->s).func = (peVar1->s).func;
        (peVar3->s).ex = eVar6;
        *(undefined4 *)&(peVar3->s).field_0xc = uVar5;
        pwVar2 = &(s->easy_filt).nv;
        *pwVar2 = *pwVar2 + L'\xffffffff';
        filter_items(s);
        sort_dat_0 = s->items;
        sort_dat_1 = (&s->default_sort)[s->config_sort_is_on].v;
        sort(s->sorted_indices,(long)s->nfilt,4,cmp_for_sort_items);
        wVar10 = extraout_EAX;
      }
    }
    else {
      local_40 = sel_has_pos_mod;
      if (apply_not) {
        local_40 = sel_has_nonpos_mod;
      }
      local_48 = sel_has_flag;
      local_50 = sel_does_not_have_flag;
      if (apply_not) {
        local_50 = sel_has_flag;
        local_48 = sel_does_not_have_flag;
      }
      local_38 = sel_at_least_resists;
      if (apply_not) {
        local_38 = sel_does_not_resist;
      }
      bVar4 = false;
      iVar23 = 0;
      peVar21 = s;
      local_88 = s;
      do {
        if ((3 < iVar23) || ((bool)(iVar23 == 3 & bVar4))) {
          peVar21->dlg_trans_msg = "Did not find attribute with that name; filter unchanged";
          wVar10 = L'\x03';
        }
        else {
          switch(iVar23) {
          case 0:
            pp_Var11 = __ctype_toupper_loc();
            local_90 = (char)(*pp_Var11)[local_8c[0]];
            lVar14 = (long)local_8c[1];
            if (lVar14 == 0) goto LAB_001cd24c;
            pp_Var11 = __ctype_tolower_loc();
            p_Var12 = *pp_Var11;
            local_8f[0] = (undefined1)p_Var12[lVar14];
            goto LAB_001cd220;
          case 1:
            pp_Var11 = __ctype_toupper_loc();
            break;
          case 2:
            pp_Var11 = __ctype_tolower_loc();
            break;
          case 3:
            pp_Var11 = __ctype_tolower_loc();
            local_90 = (char)(*pp_Var11)[local_8c[0]];
            cVar17 = local_8c[1];
            if (local_8c[1] == '\0') goto LAB_001cd24c;
            pp_Var11 = __ctype_toupper_loc();
            p_Var12 = *pp_Var11;
            puVar16 = local_8f;
            puVar19 = local_8f + 1;
            bVar18 = bVar4;
            goto LAB_001cd23b;
          default:
            goto switchD_001cd180_default;
          }
          p_Var12 = *pp_Var11;
          local_90 = (char)p_Var12[local_8c[0]];
          if ((long)local_8c[1] == 0) {
LAB_001cd24c:
            puVar16 = local_8f;
          }
          else {
            local_8f[0] = (undefined1)p_Var12[local_8c[1]];
LAB_001cd220:
            puVar16 = local_8f + 1;
            puVar19 = local_8f + 2;
            cVar17 = local_8c[2];
            bVar18 = true;
            if (local_8c[2] != '\0') {
LAB_001cd23b:
              bVar4 = bVar18;
              *puVar16 = (char)p_Var12[cVar17];
              puVar16 = puVar19;
            }
          }
          *puVar16 = 0;
switchD_001cd180_default:
          sVar13 = text_mbstowcs(&local_78,&local_90,L'\x04');
          if (sVar13 != 0xffffffffffffffff) {
            wVar20 = L'\0';
            bVar18 = true;
            iVar22 = 0;
            local_7c = iVar23;
            do {
              if (4 < iVar22) goto LAB_001cd2f8;
              if (wVar20 < s->propcats[iVar22].n) {
                if (bVar4) {
                  get_ui_entry_label(s->propcats[iVar22].entries[wVar20],L'\x04',false,&local_68);
                  if ((local_78 == local_68) && ((local_74 == local_64 && (local_70 == local_60))))
                  {
LAB_001cd2f8:
                    bVar18 = false;
                    goto LAB_001cd2ff;
                  }
                }
                else {
                  pwVar2 = s->propcats[iVar22].labels[wVar20];
                  if ((local_78 == *pwVar2) && (local_74 == pwVar2[1])) goto LAB_001cd2f8;
                }
                wVar20 = wVar20 + L'\x01';
              }
              else {
                iVar22 = iVar22 + 1;
                wVar20 = L'\0';
              }
LAB_001cd2ff:
              peVar21 = local_88;
            } while (bVar18);
            wVar10 = L'\0';
            if (iVar22 < 5) {
              local_88->config_filt_is_on = false;
              wVar10 = (local_88->easy_filt).nv;
              wVar9 = get_expected_easy_filter_count(local_88->stores);
              peVar7 = local_88;
              if (wVar10 == wVar9) {
                wVar10 = (peVar21->easy_filt).nv;
                (peVar21->easy_filt).v[wVar10].c = EQUIP_EXPR_SELECTOR;
                (peVar21->easy_filt).nv = wVar10 + L'\x01';
              }
              lVar14 = (long)(peVar21->easy_filt).nv;
              (peVar21->easy_filt).v[lVar14 + -1].s.ex.src = wVar20 + s->propcats[iVar22].off;
              p_Var15 = local_38;
              switch(iVar22) {
              case 0:
                break;
              case 1:
                p_Var15 = local_48;
                break;
              case 2:
                p_Var15 = local_50;
                break;
              case 3:
              case 4:
                p_Var15 = local_40;
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                              ,0x59f,
                              "int prompt_for_easy_filter(struct equippable_summary *, _Bool)");
              }
              (local_88->easy_filt).v[lVar14 + -1].s.func = p_Var15;
              filter_items(local_88);
              sort_dat_0 = peVar7->items;
              sort_dat_1 = (&peVar7->default_sort)[peVar7->config_sort_is_on].v;
              sort(peVar7->sorted_indices,(long)peVar7->nfilt,4,cmp_for_sort_items);
              wVar10 = L'\x03';
            }
            peVar21 = local_88;
            iVar23 = local_7c;
            if (iVar22 < 5) goto LAB_001cd433;
          }
          iVar23 = iVar23 + 1;
          wVar10 = L'\0';
        }
LAB_001cd433:
      } while (wVar10 == L'\0');
    }
  }
  return wVar10;
}

Assistant:

static int prompt_for_easy_filter(struct equippable_summary *s, bool apply_not)
{
	static const char *no_matching_attribute_msg =
		"Did not find attribute with that name; filter unchanged";
	char c[4] = "";
	int itry;
	bool threec;

	if (! get_string("Enter 2 or 3 (for stat) character code and return or return to clear ", c,
		N_ELEMENTS(c))) {
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/* Clear the current filter. */
	if (c[0] == '\0') {
		s->config_filt_is_on = false;
		if (s->easy_filt.nv >
				get_expected_easy_filter_count(s->stores)) {
			s->easy_filt.v[s->easy_filt.nv - 1] =
				s->easy_filt.v[s->easy_filt.nv];
			--s->easy_filt.nv;
			filter_items(s);
			sort_items(s);
		}
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/*
	 * Try different combinations of capitalization to match the
	 * entered string to one of the column labels.
	 */
	itry = 0;
	threec = false;
	while (1) {
		char ctry[4];
		wchar_t wc[4];

		if (itry >= 4 || (threec && itry >= 3)) {
			s->dlg_trans_msg = no_matching_attribute_msg;
			break;
		}
		switch (itry) {
		case 0:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 1:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				if (c[2] != '\0') {
					ctry[2] = toupper(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 2:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 3:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				ctry[2] = '\0';
			} else {
				ctry[1] = '\0';
			}
			break;
		}

		if (text_mbstowcs(wc, ctry, N_ELEMENTS(wc)) != (size_t)-1) {
			int j = 0, k = 0;
			bool search = true;

			while (search) {
				if (j < (int)N_ELEMENTS(s->propcats)) {
					if (k < s->propcats[j].n) {
						if (threec) {
							wchar_t wce[4];

							get_ui_entry_label(s->propcats[j].entries[k], 4, false, wce);
							if (wc[0] == wce[0] &&
							    wc[1] == wce[1] &&
							    wc[2] == wce[2]) {
								search = false;
							} else {
								++k;
							}
						} else if (wc[0] == s->propcats[j].labels[k][0] &&
							wc[1] == s->propcats[j].labels[k][1]) {
							search = false;
						} else {
							++k;
						}
					} else {
						k = 0;
						++j;
					}
				} else {
					search = false;
				}
			}

			/* Configure the new filter and apply it. */
			if (j < (int)N_ELEMENTS(s->propcats)) {
				int ind;

				s->config_filt_is_on = false;
				if (s->easy_filt.nv ==
						get_expected_easy_filter_count(s->stores)) {
					s->easy_filt.v[s->easy_filt.nv].c =
						EQUIP_EXPR_SELECTOR;
					++s->easy_filt.nv;
				}
				ind = s->easy_filt.nv - 1;
				s->easy_filt.v[ind].s.ex.propind =
					s->propcats[j].off + k;
				switch (j) {
				case 0:
					/* Resistance */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_resist :
						sel_at_least_resists;
					break;

				case 1:
					/*
					 * A boolean flag where on is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_have_flag :
						sel_has_flag;
					break;

				case 2:
					/*
					 * A boolean flag where off is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_flag :
						sel_does_not_have_flag;
					break;

				case 3:
				case 4:
					/* Integer modifier. */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_nonpos_mod :
						sel_has_pos_mod;
					break;

				default:
					assert(0);
				}

				filter_items(s);
				sort_items(s);
				break;
			}
		}

		++itry;
	}
	return EQUIP_CMP_MENU_NEW_PAGE;
}